

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::polynomial_multiplier<double,_2,_8,_1>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  iVar2 = binomial(10,8);
  iVar3 = binomial(9,7);
  pdVar1 = dst + iVar2;
  dVar5 = *pdVar1;
  lVar4 = 0;
  do {
    pdVar1[lVar4] = p1[iVar3 + lVar4] * *m2 + dVar5;
    dVar5 = p1[iVar3 + lVar4] * m2[1] + pdVar1[lVar4 + 1];
    pdVar1[lVar4 + 1] = dVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 9);
  polynomial_multiplier<double,_2,_7,_1>::mul_monomial(dst,p1,m2);
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    polynomial_multiplier<numtype, Nvar - 1, Ndeg1, Ndeg2>::mul(
        dst + binomial(Nvar + Ndeg1 + Ndeg2 - 1, Ndeg1 + Ndeg2 - 1),
        p1 + binomial(Nvar + Ndeg1 - 1, Ndeg1 - 1),
        m2);
    polynomial_multiplier<numtype, Nvar, Ndeg1 - 1, Ndeg2>::mul_monomial(
        dst, p1, m2);
  }